

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

OutputFile * __thiscall re2c::OutputFile::wu32_hex(OutputFile *this,uint32_t n)

{
  ostream *o;
  uint32_t n_local;
  OutputFile *this_local;
  
  o = stream(this);
  prtHex(o,n);
  return this;
}

Assistant:

OutputFile & OutputFile::wu32_hex (uint32_t n)
{
	prtHex (stream (), n);
	return *this;
}